

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall wallet::LegacyScriptPubKeyMan::NewKeyPool(LegacyScriptPubKeyMan *this)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  WalletBatch *this_00;
  reference plVar5;
  long *in_RDI;
  long in_FS_OFFSET;
  int64_t nIndex_2;
  set<long,_std::less<long>,_std::allocator<long>_> *__range2_2;
  int64_t nIndex_1;
  set<long,_std::less<long>,_std::allocator<long>_> *__range2_1;
  int64_t nIndex;
  set<long,_std::less<long>,_std::allocator<long>_> *__range2;
  iterator __end2_2;
  iterator __begin2_2;
  iterator __end2_1;
  iterator __begin2_1;
  iterator __end2;
  iterator __begin2;
  WalletBatch batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock41;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  WalletBatch *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint uVar6;
  char *in_stack_ffffffffffffff58;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff60;
  ScriptPubKeyMan *in_stack_ffffffffffffff68;
  ConstevalFormatString<0U> wallet_fmt;
  byte local_59;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  wallet_fmt.fmt = (char *)in_RDI;
  uVar4 = (**(code **)(*(long *)in_RDI[1] + 0x20))((long *)in_RDI[1],0x100000000);
  if ((uVar4 & 1) == 0) {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)
               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff48 >> 0x18,0));
    this_00 = (WalletBatch *)(**(code **)(*(long *)in_RDI[1] + 0x18))();
    WalletBatch::WalletBatch
              (this_00,(WalletDatabase *)
                       CONCAT17(in_stack_ffffffffffffff37,
                                CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
               (bool)in_stack_ffffffffffffff2f);
    std::set<long,_std::less<long>,_std::allocator<long>_>::begin
              ((set<long,_std::less<long>,_std::allocator<long>_> *)
               CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
    std::set<long,_std::less<long>,_std::allocator<long>_>::end
              ((set<long,_std::less<long>,_std::allocator<long>_> *)
               CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
    while (bVar2 = std::operator==((_Self *)this_00,
                                   (_Self *)CONCAT17(in_stack_ffffffffffffff37,
                                                     CONCAT16(in_stack_ffffffffffffff36,
                                                              in_stack_ffffffffffffff30))),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      std::_Rb_tree_const_iterator<long>::operator*
                ((_Rb_tree_const_iterator<long> *)
                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      WalletBatch::ErasePool
                (in_stack_ffffffffffffff48,
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      std::_Rb_tree_const_iterator<long>::operator++
                ((_Rb_tree_const_iterator<long> *)
                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    }
    std::set<long,_std::less<long>,_std::allocator<long>_>::clear
              ((set<long,_std::less<long>,_std::allocator<long>_> *)
               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    std::set<long,_std::less<long>,_std::allocator<long>_>::begin
              ((set<long,_std::less<long>,_std::allocator<long>_> *)
               CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
    std::set<long,_std::less<long>,_std::allocator<long>_>::end
              ((set<long,_std::less<long>,_std::allocator<long>_> *)
               CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
    while (bVar2 = std::operator==((_Self *)this_00,
                                   (_Self *)CONCAT17(in_stack_ffffffffffffff37,
                                                     CONCAT16(in_stack_ffffffffffffff36,
                                                              in_stack_ffffffffffffff30))),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      plVar5 = std::_Rb_tree_const_iterator<long>::operator*
                         ((_Rb_tree_const_iterator<long> *)
                          CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      in_stack_ffffffffffffff68 = (ScriptPubKeyMan *)*plVar5;
      WalletBatch::ErasePool
                (in_stack_ffffffffffffff48,
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      std::_Rb_tree_const_iterator<long>::operator++
                ((_Rb_tree_const_iterator<long> *)
                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    }
    std::set<long,_std::less<long>,_std::allocator<long>_>::clear
              ((set<long,_std::less<long>,_std::allocator<long>_> *)
               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    std::set<long,_std::less<long>,_std::allocator<long>_>::begin
              ((set<long,_std::less<long>,_std::allocator<long>_> *)
               CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
    std::set<long,_std::less<long>,_std::allocator<long>_>::end
              ((set<long,_std::less<long>,_std::allocator<long>_> *)
               CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
    while (bVar2 = std::operator==((_Self *)this_00,
                                   (_Self *)CONCAT17(in_stack_ffffffffffffff37,
                                                     CONCAT16(in_stack_ffffffffffffff36,
                                                              in_stack_ffffffffffffff30))),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      std::_Rb_tree_const_iterator<long>::operator*
                ((_Rb_tree_const_iterator<long> *)
                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      WalletBatch::ErasePool
                (in_stack_ffffffffffffff48,
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      std::_Rb_tree_const_iterator<long>::operator++
                ((_Rb_tree_const_iterator<long> *)
                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    }
    std::set<long,_std::less<long>,_std::allocator<long>_>::clear
              ((set<long,_std::less<long>,_std::allocator<long>_> *)
               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    std::map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>::
    clear((map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_> *)
          CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    bVar3 = (**(code **)(*in_RDI + 0x48))(in_RDI,0);
    bVar2 = (bVar3 & 1) != 0;
    if (bVar2) {
      ScriptPubKeyMan::WalletLogPrintf<>(in_stack_ffffffffffffff68,wallet_fmt);
    }
    else {
      local_59 = 0;
    }
    uVar6 = (uint)!bVar2;
    WalletBatch::~WalletBatch
              ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    if (uVar6 == 0) {
      local_59 = 1;
    }
  }
  else {
    local_59 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_59 & 1);
}

Assistant:

bool LegacyScriptPubKeyMan::NewKeyPool()
{
    if (m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        return false;
    }
    {
        LOCK(cs_KeyStore);
        WalletBatch batch(m_storage.GetDatabase());

        for (const int64_t nIndex : setInternalKeyPool) {
            batch.ErasePool(nIndex);
        }
        setInternalKeyPool.clear();

        for (const int64_t nIndex : setExternalKeyPool) {
            batch.ErasePool(nIndex);
        }
        setExternalKeyPool.clear();

        for (const int64_t nIndex : set_pre_split_keypool) {
            batch.ErasePool(nIndex);
        }
        set_pre_split_keypool.clear();

        m_pool_key_to_index.clear();

        if (!TopUp()) {
            return false;
        }
        WalletLogPrintf("LegacyScriptPubKeyMan::NewKeyPool rewrote keypool\n");
    }
    return true;
}